

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_wallmarks.cxx
# Opt level: O0

void __thiscall read_wm_slot::operator()(read_wm_slot *this,wm_slot **_slot,xr_reader *r)

{
  uint32_t uVar1;
  wm_slot *this_00;
  size_t n;
  wm_slot *slot;
  xr_reader *r_local;
  wm_slot **_slot_local;
  read_wm_slot *this_local;
  
  this_00 = (wm_slot *)operator_new(0x58);
  xray_re::wm_slot::wm_slot(this_00);
  *_slot = this_00;
  uVar1 = xray_re::xr_reader::r_u32(r);
  xray_re::xr_reader::r_sz(r,(string *)this_00);
  xray_re::xr_reader::r_sz(r,&this_00->texture);
  xray_re::xr_reader::
  r_seq<std::vector<xray_re::wm_data,std::allocator<xray_re::wm_data>>,read_wm_data>
            (r,uVar1,&this_00->wallmarks);
  return;
}

Assistant:

void operator()(wm_slot*& _slot, xr_reader& r) const {
	wm_slot* slot = new wm_slot;
	_slot = slot;
	size_t n = r.r_u32();
	r.r_sz(slot->shader);
	r.r_sz(slot->texture);
	r.r_seq(n, slot->wallmarks, read_wm_data());
}